

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionaryProvider.h
# Opt level: O3

void __thiscall
FIX::DataDictionaryProvider::addTransportDataDictionary
          (DataDictionaryProvider *this,BeginString *beginString,string *path)

{
  DataDictionary *this_00;
  DataDictionary *local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  this_00 = (DataDictionary *)operator_new(0x3e0);
  FIX::DataDictionary::DataDictionary(this_00,(string *)path,false);
  local_30 = this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<FIX::DataDictionary*>
            (&local_28,this_00);
  FIX::DataDictionaryProvider::addTransportDataDictionary(this,beginString,&local_30);
  if (local_28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28._M_pi);
  }
  return;
}

Assistant:

void addTransportDataDictionary(const BeginString &beginString, const std::string &path) {
    addTransportDataDictionary(beginString, std::shared_ptr<DataDictionary>(new DataDictionary(path)));
  }